

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O3

int fio_base64_decode(char *target,char *encoded,int base64_len)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  ushort **ppuVar5;
  long lVar6;
  int *piVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  byte *pbVar12;
  byte *pbVar13;
  
  if (target == (char *)0x0) {
    target = encoded;
  }
  if (base64_len < 1) {
    iVar8 = 0;
    goto LAB_0013ab04;
  }
  uVar11 = (ulong)(uint)base64_len;
  do {
    if (base64_decodes[(byte)encoded[uVar11 - 1]] != 0) {
      if (uVar11 != 0) {
        ppuVar5 = __ctype_b_loc();
        iVar4 = (int)uVar11;
        lVar6 = 0;
        goto LAB_0013aac2;
      }
      break;
    }
    uVar11 = uVar11 - 1;
  } while (uVar11 != 0);
  iVar8 = 0;
  goto LAB_0013aadf;
  while (lVar6 = lVar6 + 1, iVar4 != (int)lVar6) {
LAB_0013aac2:
    if ((*(byte *)((long)*ppuVar5 + (ulong)(byte)encoded[lVar6] * 2 + 1) & 0x20) == 0) {
      pbVar12 = (byte *)(encoded + lVar6);
      iVar9 = iVar4 - (int)lVar6;
      iVar8 = 0;
      pbVar13 = pbVar12;
      iVar10 = iVar9;
      if (3 < iVar4 - (int)lVar6) goto LAB_0013ab34;
      goto LAB_0013abee;
    }
  }
  iVar8 = 0;
  encoded = encoded + (uVar11 & 0xffffffff);
  goto LAB_0013aadf;
  while( true ) {
    *target = ((byte)(uVar1 >> 4) & 3) + (char)base64_decodes[*pbVar12] * '\x04';
    ((byte *)target)[1] = (byte)(uVar2 >> 2) & 0xf | (byte)(uVar1 << 4);
    ((byte *)target)[2] = (byte)uVar3 & 0x3f | (byte)(uVar2 << 6);
    target = (char *)((byte *)target + 3);
    iVar8 = iVar8 + 3;
    iVar9 = iVar10 + -4;
    if (iVar9 == 0) goto LAB_0013aadf;
    ppuVar5 = __ctype_b_loc();
    while ((*(byte *)((long)*ppuVar5 + (long)(char)*pbVar13 * 2 + 1) & 0x20) != 0) {
      pbVar13 = pbVar13 + 1;
      iVar9 = iVar9 + -1;
      if (iVar9 == 0) {
        encoded = (char *)(pbVar12 + (ulong)(iVar10 - 5) + 5);
        goto LAB_0013aadf;
      }
    }
    pbVar12 = pbVar13;
    iVar10 = iVar9;
    if (iVar9 < 4) break;
LAB_0013ab34:
    pbVar13 = pbVar12 + 4;
    encoded = (char *)pbVar13;
    if ((((base64_decodes[*pbVar12] == 0) || (uVar1 = base64_decodes[pbVar12[1]], uVar1 == 0)) ||
        (uVar2 = base64_decodes[pbVar12[2]], uVar2 == 0)) ||
       (uVar3 = base64_decodes[pbVar12[3]], uVar3 == 0)) goto LAB_0013ac31;
  }
LAB_0013abee:
  if (iVar9 == 3) {
    encoded = (char *)(pbVar13 + 3);
    if (((base64_decodes[*pbVar13] == 0) || (uVar1 = base64_decodes[pbVar13[1]], uVar1 == 0)) ||
       (uVar2 = base64_decodes[pbVar13[2]], uVar2 == 0)) {
LAB_0013acc0:
      piVar7 = __errno_location();
      *piVar7 = 0x22;
    }
    else {
      *target = (char)base64_decodes[*pbVar13] << 2;
      ((byte *)target)[1] = (byte)(uVar2 >> 2) & 0xf | (byte)(uVar1 << 4);
      ((byte *)target)[2] = (char)uVar2 << 6;
      target = (char *)((byte *)target + 3);
      iVar8 = iVar8 + 3;
    }
  }
  else if (iVar9 == 2) {
    encoded = (char *)(pbVar13 + 2);
    if ((base64_decodes[*pbVar13] == 0) || (uVar1 = base64_decodes[pbVar13[1]], uVar1 == 0))
    goto LAB_0013acc0;
    *target = (char)base64_decodes[*pbVar13] << 2;
    ((byte *)target)[1] = (char)uVar1 << 4;
    target = (char *)((byte *)target + 2);
    iVar8 = iVar8 + 2;
  }
  else {
    encoded = (char *)pbVar13;
    if (iVar9 == 1) {
      encoded = (char *)(pbVar13 + 1);
      if (base64_decodes[*pbVar13] == 0) {
LAB_0013ac31:
        piVar7 = __errno_location();
        *piVar7 = 0x22;
      }
      else {
        *target = (byte)base64_decodes[*pbVar13] & 0x3f;
        target = (char *)((byte *)target + 1);
        iVar8 = iVar8 + 1;
      }
    }
  }
LAB_0013aadf:
  if (((byte *)encoded)[-1] == 0x3d) {
    target = (char *)((byte *)target + ~(ulong)(((byte *)encoded)[-2] == 0x3d));
    iVar4 = ~(uint)(((byte *)encoded)[-2] == 0x3d) + iVar8;
    iVar8 = 0;
    if (0 < iVar4) {
      iVar8 = iVar4;
    }
  }
LAB_0013ab04:
  *target = 0;
  return iVar8;
}

Assistant:

int fio_base64_decode(char *target, char *encoded, int base64_len) {
  if (!target)
    target = encoded;
  if (base64_len <= 0) {
    target[0] = 0;
    return 0;
  }
  int written = 0;
  uint8_t tmp1, tmp2, tmp3, tmp4;
  // skip unknown data at end
  while (base64_len &&
         !base64_decodes[*(uint8_t *)(encoded + (base64_len - 1))]) {
    base64_len--;
  }
  // skip white space
  while (base64_len && isspace((*(uint8_t *)encoded))) {
    base64_len--;
    encoded++;
  }
  while (base64_len >= 4) {
    if (!base64_len) {
      return written;
    }
    tmp1 = *(uint8_t *)(encoded++);
    tmp2 = *(uint8_t *)(encoded++);
    tmp3 = *(uint8_t *)(encoded++);
    tmp4 = *(uint8_t *)(encoded++);
    if (!base64_decodes[tmp1] || !base64_decodes[tmp2] ||
        !base64_decodes[tmp3] || !base64_decodes[tmp4]) {
      errno = ERANGE;
      goto finish;
    }
    *(target++) = (BITVAL(tmp1) << 2) | (BITVAL(tmp2) >> 4);
    *(target++) = (BITVAL(tmp2) << 4) | (BITVAL(tmp3) >> 2);
    *(target++) = (BITVAL(tmp3) << 6) | (BITVAL(tmp4));
    // make sure we don't loop forever.
    base64_len -= 4;
    // count written bytes
    written += 3;
    // skip white space
    while (base64_len && isspace((*encoded))) {
      base64_len--;
      encoded++;
    }
  }
  // deal with the "tail" of the mis-encoded stream - this shouldn't happen
  tmp1 = 0;
  tmp2 = 0;
  tmp3 = 0;
  tmp4 = 0;
  switch (base64_len) {
  case 1:
    tmp1 = *(uint8_t *)(encoded++);
    if (!base64_decodes[tmp1]) {
      errno = ERANGE;
      goto finish;
    }
    *(target++) = BITVAL(tmp1);
    written += 1;
    break;
  case 2:
    tmp1 = *(uint8_t *)(encoded++);
    tmp2 = *(uint8_t *)(encoded++);
    if (!base64_decodes[tmp1] || !base64_decodes[tmp2]) {
      errno = ERANGE;
      goto finish;
    }
    *(target++) = (BITVAL(tmp1) << 2) | (BITVAL(tmp2) >> 6);
    *(target++) = (BITVAL(tmp2) << 4);
    written += 2;
    break;
  case 3:
    tmp1 = *(uint8_t *)(encoded++);
    tmp2 = *(uint8_t *)(encoded++);
    tmp3 = *(uint8_t *)(encoded++);
    if (!base64_decodes[tmp1] || !base64_decodes[tmp2] ||
        !base64_decodes[tmp3]) {
      errno = ERANGE;
      goto finish;
    }
    *(target++) = (BITVAL(tmp1) << 2) | (BITVAL(tmp2) >> 6);
    *(target++) = (BITVAL(tmp2) << 4) | (BITVAL(tmp3) >> 2);
    *(target++) = BITVAL(tmp3) << 6;
    written += 3;
    break;
  }
finish:
  if (encoded[-1] == '=') {
    target--;
    written--;
    if (encoded[-2] == '=') {
      target--;
      written--;
    }
    if (written < 0)
      written = 0;
  }
  *target = 0;
  return written;
}